

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConversion.hxx
# Opt level: O0

string * __thiscall
FileParse::enumToString<BSDFData::ScatteringDataType,4ul>
          (string *__return_storage_ptr__,FileParse *this,ScatteringDataType value,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *values)

{
  ulong uVar1;
  size_type sVar2;
  const_reference __str;
  undefined4 in_register_00000014;
  allocator<char> local_29;
  size_type local_28;
  size_t index;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  *values_local;
  string *psStack_10;
  ScatteringDataType value_local;
  
  index = CONCAT44(in_register_00000014,value);
  values_local._4_4_ = (int)this;
  uVar1 = (ulong)values_local._4_4_;
  local_28 = uVar1;
  psStack_10 = __return_storage_ptr__;
  sVar2 = std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          ::size((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                  *)index);
  if (uVar1 < sVar2) {
    __str = std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
            ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                          *)index,local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string enumToString(EnumType value, const std::array<std::string, N> & values)
    {
        const auto index{static_cast<std::size_t>(value)};
        if(index < values.size())
        {
            return values[index];
        }
        return "Unknown";
    }